

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O3

bool vkt::image::anon_unknown_0::comparePixelBuffers
               (TestLog *log,Texture *texture,VkFormat format,ConstPixelBufferAccess *reference,
               ConstPixelBufferAccess *result)

{
  bool bVar1;
  bool bVar2;
  IVec3 *pIVar3;
  long *plVar4;
  TextureFormat *pTVar5;
  long *plVar6;
  ulong *puVar7;
  TextureFormat TVar8;
  uint layer;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ConstPixelBufferAccess resultLayer;
  string comparisonDesc;
  string comparisonName;
  ConstPixelBufferAccess refLayer;
  bool local_389;
  undefined1 local_388 [16];
  long local_378;
  TextureFormat TStack_370;
  uint local_35c;
  ulong *local_358;
  long local_350;
  ulong local_348;
  long lStack_340;
  ImageType local_334;
  TestLog *local_330;
  ConstPixelBufferAccess *local_328;
  ConstPixelBufferAccess *local_320;
  ulong *local_318;
  long local_310;
  ulong local_308 [2];
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  long *local_2d8;
  long local_2d0;
  long local_2c8;
  long lStack_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  long *local_298 [2];
  long local_288 [2];
  long *local_278 [2];
  long local_268 [2];
  Vec4 local_258;
  IVec3 *local_240;
  IVec3 *local_238;
  IVec3 *local_230;
  IVec3 *local_228;
  Texture *local_220;
  long *local_218 [2];
  long local_208 [2];
  ConstPixelBufferAccess local_1f8;
  ConstPixelBufferAccess local_1d0;
  ConstPixelBufferAccess local_1a8 [2];
  ios_base local_138 [264];
  
  local_330 = log;
  local_328 = result;
  local_320 = reference;
  bVar2 = ::vk::isIntFormat(format);
  local_389 = true;
  if (!bVar2) {
    local_389 = ::vk::isUintFormat(format);
  }
  local_334 = texture->m_type;
  if (local_334 == IMAGE_TYPE_3D) {
    Texture::size(texture);
    pIVar3 = &local_1a8[0].m_size;
  }
  else {
    pIVar3 = (IVec3 *)&texture->m_numLayers;
  }
  local_35c = pIVar3->m_data[0];
  if ((int)local_35c < 1) {
    uVar11 = 0;
  }
  else {
    local_228 = &local_320->m_size;
    local_230 = &local_320->m_pitch;
    local_238 = &local_328->m_size;
    local_240 = &local_328->m_pitch;
    uVar11 = 0;
    layer = 0;
    local_220 = texture;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,layer);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_388,0,(char *)0x0,0xae9b29);
      local_2b8 = &local_2a8;
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_2a8 = *plVar6;
        lStack_2a0 = plVar4[3];
      }
      else {
        local_2a8 = *plVar6;
        local_2b8 = (long *)*plVar4;
      }
      local_2b0 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((long *)local_388._0_8_ != &local_378) {
        operator_delete((void *)local_388._0_8_,local_378 + 1);
      }
      uVar10 = texture->m_type - IMAGE_TYPE_CUBE;
      if (uVar10 < 2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,layer % 6);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0xb84d76);
        local_2f8 = &local_2e8;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_2e8 = *plVar6;
          lStack_2e0 = plVar4[3];
        }
        else {
          local_2e8 = *plVar6;
          local_2f8 = (long *)*plVar4;
        }
        local_2f0 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_2f8);
        local_358 = &local_348;
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar7) {
          local_348 = *puVar7;
          lStack_340 = plVar4[3];
        }
        else {
          local_348 = *puVar7;
          local_358 = (ulong *)*plVar4;
        }
        local_350 = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,layer / 6);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar9 = 0xf;
        if (local_358 != &local_348) {
          uVar9 = local_348;
        }
        if (uVar9 < (ulong)(local_310 + local_350)) {
          uVar9 = 0xf;
          if (local_318 != local_308) {
            uVar9 = local_308[0];
          }
          if (uVar9 < (ulong)(local_310 + local_350)) goto LAB_00728f56;
          pTVar5 = (TextureFormat *)
                   std::__cxx11::string::replace((ulong)&local_318,0,(char *)0x0,(ulong)local_358);
        }
        else {
LAB_00728f56:
          pTVar5 = (TextureFormat *)
                   std::__cxx11::string::_M_append((char *)&local_358,(ulong)local_318);
        }
        local_388._0_8_ = &local_378;
        TVar8 = (TextureFormat)(pTVar5 + 2);
        if (*pTVar5 == TVar8) {
          local_378 = *(long *)TVar8;
          TStack_370 = pTVar5[3];
        }
        else {
          local_378 = *(long *)TVar8;
          local_388._0_8_ = *pTVar5;
        }
        local_388._8_8_ = pTVar5[1];
        *pTVar5 = TVar8;
        bVar2 = false;
LAB_00728fd0:
        bVar1 = false;
      }
      else {
        if (local_334 == IMAGE_TYPE_3D) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::ostream::operator<<(local_1a8,layer);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          pTVar5 = (TextureFormat *)
                   std::__cxx11::string::replace((ulong)local_298,0,(char *)0x0,0xb3b0a1);
          local_388._0_8_ = &local_378;
          TVar8 = (TextureFormat)(pTVar5 + 2);
          if (*pTVar5 == TVar8) {
            local_378 = *(long *)TVar8;
            TStack_370 = pTVar5[3];
          }
          else {
            local_378 = *(long *)TVar8;
            local_388._0_8_ = *pTVar5;
          }
          local_388._8_8_ = pTVar5[1];
          *pTVar5 = TVar8;
          bVar2 = true;
          goto LAB_00728fd0;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,layer);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        pTVar5 = (TextureFormat *)
                 std::__cxx11::string::replace((ulong)local_278,0,(char *)0x0,0xae90dc);
        local_388._0_8_ = &local_378;
        TVar8 = (TextureFormat)(pTVar5 + 2);
        if (*pTVar5 == TVar8) {
          local_378 = *(long *)TVar8;
          TStack_370 = pTVar5[3];
        }
        else {
          local_378 = *(long *)TVar8;
          local_388._0_8_ = *pTVar5;
        }
        local_388._8_8_ = pTVar5[1];
        *pTVar5 = TVar8;
        bVar1 = true;
        bVar2 = false;
      }
      pTVar5[1].order = R;
      pTVar5[1].type = SNORM_INT8;
      *(undefined1 *)TVar8 = 0;
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_388,0,(char *)0x0,0xb3b086);
      local_2d8 = &local_2c8;
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_2c8 = *plVar6;
        lStack_2c0 = plVar4[3];
      }
      else {
        local_2c8 = *plVar6;
        local_2d8 = (long *)*plVar4;
      }
      local_2d0 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((long *)local_388._0_8_ != &local_378) {
        operator_delete((void *)local_388._0_8_,local_378 + 1);
      }
      if ((bVar1) && (local_278[0] != local_268)) {
        operator_delete(local_278[0],local_268[0] + 1);
      }
      if ((bVar2) && (local_298[0] != local_288)) {
        operator_delete(local_298[0],local_288[0] + 1);
      }
      texture = local_220;
      if (uVar10 < 2) {
        if (local_318 != local_308) {
          operator_delete(local_318,local_308[0] + 1);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358,local_348 + 1);
        }
        if (local_2f8 != &local_2e8) {
          operator_delete(local_2f8,local_2e8 + 1);
        }
        if (local_218[0] != local_208) {
          operator_delete(local_218[0],local_208[0] + 1);
        }
      }
      local_1d0.m_format = local_320->m_format;
      local_1d0.m_size.m_data[2] = local_228->m_data[2];
      local_1d0.m_size.m_data._0_8_ = *(undefined8 *)local_228->m_data;
      local_1d0.m_pitch.m_data[2] = local_230->m_data[2];
      local_1d0.m_pitch.m_data._0_8_ = *(undefined8 *)local_230->m_data;
      local_1d0.m_data = local_320->m_data;
      getLayerOrSlice(local_1a8,(Texture *)(ulong)texture->m_type,&local_1d0,layer);
      local_1f8.m_format = local_328->m_format;
      local_1f8.m_size.m_data[2] = local_238->m_data[2];
      local_1f8.m_size.m_data._0_8_ = *(undefined8 *)local_238->m_data;
      local_1f8.m_pitch.m_data[2] = local_240->m_data[2];
      local_1f8.m_pitch.m_data._0_8_ = *(undefined8 *)local_240->m_data;
      local_1f8.m_data = local_328->m_data;
      getLayerOrSlice((ConstPixelBufferAccess *)local_388,(Texture *)(ulong)texture->m_type,
                      &local_1f8,layer);
      if (local_389 == false) {
        local_258.m_data[0] = 0.01;
        local_258.m_data[1] = 0.01;
        local_258.m_data[2] = 0.01;
        local_258.m_data[3] = 0.01;
        bVar2 = tcu::floatThresholdCompare
                          (local_330,(char *)local_2b8,(char *)local_2d8,local_1a8,
                           (ConstPixelBufferAccess *)local_388,&local_258,COMPARE_LOG_RESULT);
      }
      else {
        local_258.m_data[0] = 0.0;
        local_258.m_data[1] = 0.0;
        local_258.m_data[2] = 0.0;
        local_258.m_data[3] = 0.0;
        bVar2 = tcu::intThresholdCompare
                          (local_330,(char *)local_2b8,(char *)local_2d8,local_1a8,
                           (ConstPixelBufferAccess *)local_388,(UVec4 *)&local_258,
                           COMPARE_LOG_RESULT);
      }
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8,local_2c8 + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      uVar11 = uVar11 + bVar2;
      layer = layer + 1;
    } while (local_35c != layer);
  }
  return uVar11 == local_35c;
}

Assistant:

bool comparePixelBuffers (tcu::TestLog&						log,
						  const Texture&					texture,
						  const VkFormat					format,
						  const tcu::ConstPixelBufferAccess	reference,
						  const tcu::ConstPixelBufferAccess	result)
{
	DE_ASSERT(reference.getFormat() == result.getFormat());
	DE_ASSERT(reference.getSize() == result.getSize());

	const bool intFormat = isIntegerFormat(format);
	const bool is3d = (texture.type() == IMAGE_TYPE_3D);
	const int numLayersOrSlices = (is3d ? texture.size().z() : texture.numLayers());
	const int numCubeFaces = 6;

	int passedLayers = 0;
	for (int layerNdx = 0; layerNdx < numLayersOrSlices; ++layerNdx)
	{
		const std::string comparisonName = "Comparison" + de::toString(layerNdx);
		const std::string comparisonDesc = "Image Comparison, " +
			(isCube(texture) ? "face " + de::toString(layerNdx % numCubeFaces) + ", cube " + de::toString(layerNdx / numCubeFaces) :
			is3d			 ? "slice " + de::toString(layerNdx) : "layer " + de::toString(layerNdx));

		const tcu::ConstPixelBufferAccess refLayer = getLayerOrSlice(texture, reference, layerNdx);
		const tcu::ConstPixelBufferAccess resultLayer = getLayerOrSlice(texture, result, layerNdx);

		bool ok = false;
		if (intFormat)
			ok = tcu::intThresholdCompare(log, comparisonName.c_str(), comparisonDesc.c_str(), refLayer, resultLayer, tcu::UVec4(0), tcu::COMPARE_LOG_RESULT);
		else
			ok = tcu::floatThresholdCompare(log, comparisonName.c_str(), comparisonDesc.c_str(), refLayer, resultLayer, tcu::Vec4(0.01f), tcu::COMPARE_LOG_RESULT);

		if (ok)
			++passedLayers;
	}
	return passedLayers == numLayersOrSlices;
}